

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_tag
          (version_parser *this,string *out,
          vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
          *out_identifiers)

{
  bool bVar1;
  char *pcVar2;
  from_chars_result fVar3;
  string identifier;
  string result;
  undefined1 local_58 [40];
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  while( true ) {
    if (result._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&result);
    }
    identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
    identifier._M_string_length = 0;
    identifier.field_2._M_local_buf[0] = '\0';
    fVar3 = parse_prerelease_identifier(this,&identifier);
    pcVar2 = fVar3.super_from_chars_result.ptr;
    if (fVar3.super_from_chars_result.ec != 0) break;
    std::__cxx11::string::append((string *)&result);
    make_prerelease_identifier((prerelease_identifier *)local_58,this,&identifier);
    std::
    vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
    ::emplace_back<semver::detail::prerelease_identifier>
              (out_identifiers,(prerelease_identifier *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&identifier);
    bVar1 = token_stream::advanceIfMatch(this->stream,dot);
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)out);
      pcVar2 = (this->stream->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start[this->stream->current].lexeme;
LAB_00102e00:
      std::__cxx11::string::~string((string *)&result);
      fVar3.super_from_chars_result.ptr = pcVar2;
      fVar3.super_from_chars_result._12_4_ = 0;
      return (from_chars_result)fVar3.super_from_chars_result;
    }
  }
  std::__cxx11::string::~string((string *)&identifier);
  goto LAB_00102e00;
}

Assistant:

parse_prerelease_tag(std::string& out, std::vector<detail::prerelease_identifier>& out_identifiers) {
    std::string result;

    do {
      if (!result.empty()) {
        result.push_back('.');
      }

      std::string identifier;
      if (const auto res = parse_prerelease_identifier(identifier); !res) {
        return res;
      }

      result.append(identifier);
      out_identifiers.push_back(make_prerelease_identifier(identifier));

    } while (stream.advanceIfMatch(token_type::dot));

    out = result;
    return success(stream.peek().lexeme);
  }